

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O1

void __thiscall
LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false>::~LinkedListPool
          (LinkedListPool<depspawn::internal::Workitem::_dep,_true,_false> *this)

{
  pointer pp_Var1;
  pointer pp_Var2;
  
  pp_Var1 = (this->v_).
            super__Vector_base<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (pp_Var2 = (this->v_).
                 super__Vector_base<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; pp_Var2 != pp_Var1;
      pp_Var2 = pp_Var2 + 1) {
    free(*pp_Var2);
  }
  pp_Var2 = (this->v_).
            super__Vector_base<depspawn::internal::Workitem::_dep_*,_std::allocator<depspawn::internal::Workitem::_dep_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pp_Var2 != (pointer)0x0) {
    operator_delete(pp_Var2);
    return;
  }
  return;
}

Assistant:

~LinkedListPool()
  {
    typename vector_t::const_iterator const itend = v_.end();
    for(typename vector_t::const_iterator it = v_.begin(); it != itend; ++it)
      PoolAllocator_malloc_free<SCALABLE>::free(reinterpret_cast<char*>(*it));
  }